

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

float tcu::execCompare(Vec4 *color,CompareMode compare,int chanNdx,float ref_,bool isFixedPoint)

{
  bool bVar1;
  float *pfVar2;
  float fVar3;
  float local_44;
  float local_34;
  bool res;
  float ref;
  float cmp;
  bool clampValues;
  bool isFixedPoint_local;
  float ref__local;
  int chanNdx_local;
  CompareMode compare_local;
  Vec4 *color_local;
  
  if (isFixedPoint) {
    pfVar2 = Vector<float,_4>::operator[](color,chanNdx);
    fVar3 = de::clamp<float>(*pfVar2,0.0,1.0);
    local_34 = de::clamp<float>(ref_,0.0,1.0);
  }
  else {
    pfVar2 = Vector<float,_4>::operator[](color,chanNdx);
    fVar3 = *pfVar2;
    local_34 = ref_;
  }
  bVar1 = false;
  switch(compare) {
  case COMPAREMODE_LESS:
    bVar1 = local_34 < fVar3;
    break;
  case COMPAREMODE_LESS_OR_EQUAL:
    bVar1 = local_34 <= fVar3;
    break;
  case COMPAREMODE_GREATER:
    bVar1 = fVar3 < local_34;
    break;
  case COMPAREMODE_GREATER_OR_EQUAL:
    bVar1 = fVar3 <= local_34;
    break;
  case COMPAREMODE_EQUAL:
    bVar1 = local_34 == fVar3;
    break;
  case COMPAREMODE_NOT_EQUAL:
    bVar1 = local_34 != fVar3;
    break;
  case COMPAREMODE_ALWAYS:
    bVar1 = true;
    break;
  case COMPAREMODE_NEVER:
    bVar1 = false;
  }
  local_44 = 1.0;
  if (!bVar1) {
    local_44 = 0.0;
  }
  return local_44;
}

Assistant:

static inline float execCompare (const tcu::Vec4& color, Sampler::CompareMode compare, int chanNdx, float ref_, bool isFixedPoint)
{
	const bool	clampValues	= isFixedPoint;	// if comparing against a floating point texture, ref (and value) is not clamped
	const float	cmp			= (clampValues) ? (de::clamp(color[chanNdx], 0.0f, 1.0f)) : (color[chanNdx]);
	const float	ref			= (clampValues) ? (de::clamp(ref_, 0.0f, 1.0f)) : (ref_);
	bool		res			= false;

	switch (compare)
	{
		case Sampler::COMPAREMODE_LESS:				res = ref < cmp;	break;
		case Sampler::COMPAREMODE_LESS_OR_EQUAL:	res = ref <= cmp;	break;
		case Sampler::COMPAREMODE_GREATER:			res = ref > cmp;	break;
		case Sampler::COMPAREMODE_GREATER_OR_EQUAL:	res = ref >= cmp;	break;
		case Sampler::COMPAREMODE_EQUAL:			res = ref == cmp;	break;
		case Sampler::COMPAREMODE_NOT_EQUAL:		res = ref != cmp;	break;
		case Sampler::COMPAREMODE_ALWAYS:			res = true;			break;
		case Sampler::COMPAREMODE_NEVER:			res = false;		break;
		default:
			DE_ASSERT(false);
	}

	return res ? 1.0f : 0.0f;
}